

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refdbm.cc
# Opt level: O0

bool tchecker::refdbm::is_sync_alu_le
               (db_t *rdbm1,db_t *rdbm2,reference_clock_variables_t *r,integer_t *l,integer_t *u)

{
  bool bVar1;
  db_t dVar2;
  size_t sVar3;
  ulong uVar4;
  db_t *local_c8;
  bool local_b9;
  db_t *local_b8;
  db_t *local_a8;
  db_t *local_a0;
  db_t *local_98;
  db_t *local_90;
  db_t *local_88;
  db_t local_7c;
  db_t local_78;
  int local_74;
  db_t local_70;
  integer_t Ly;
  clock_id_t y;
  db_t local_64;
  clock_id_t t_1;
  db_t min_tx2;
  uint local_58;
  db_t local_54;
  clock_id_t t;
  db_t min_tx1;
  integer_t Ux;
  clock_id_t x;
  size_t refcount;
  size_t rdim;
  integer_t *u_local;
  integer_t *l_local;
  reference_clock_variables_t *r_local;
  db_t *rdbm2_local;
  db_t *rdbm1_local;
  
  if (rdbm1 == (db_t *)0x0) {
    __assert_fail("rdbm1 != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x198,
                  "bool tchecker::refdbm::is_sync_alu_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, const tchecker::integer_t *, const tchecker::integer_t *)"
                 );
  }
  if (rdbm2 == (db_t *)0x0) {
    __assert_fail("rdbm2 != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x199,
                  "bool tchecker::refdbm::is_sync_alu_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, const tchecker::integer_t *, const tchecker::integer_t *)"
                 );
  }
  bVar1 = is_consistent(rdbm1,r);
  if (!bVar1) {
    __assert_fail("tchecker::refdbm::is_consistent(rdbm1, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x19a,
                  "bool tchecker::refdbm::is_sync_alu_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, const tchecker::integer_t *, const tchecker::integer_t *)"
                 );
  }
  bVar1 = is_consistent(rdbm2,r);
  if (!bVar1) {
    __assert_fail("tchecker::refdbm::is_consistent(rdbm2, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x19b,
                  "bool tchecker::refdbm::is_sync_alu_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, const tchecker::integer_t *, const tchecker::integer_t *)"
                 );
  }
  bVar1 = is_positive(rdbm1,r);
  if (!bVar1) {
    __assert_fail("tchecker::refdbm::is_positive(rdbm1, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x19c,
                  "bool tchecker::refdbm::is_sync_alu_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, const tchecker::integer_t *, const tchecker::integer_t *)"
                 );
  }
  bVar1 = is_positive(rdbm2,r);
  if (!bVar1) {
    __assert_fail("tchecker::refdbm::is_positive(rdbm2, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x19d,
                  "bool tchecker::refdbm::is_sync_alu_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, const tchecker::integer_t *, const tchecker::integer_t *)"
                 );
  }
  bVar1 = is_tight(rdbm1,r);
  if (!bVar1) {
    __assert_fail("tchecker::refdbm::is_tight(rdbm1, r)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x19e,
                  "bool tchecker::refdbm::is_sync_alu_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, const tchecker::integer_t *, const tchecker::integer_t *)"
                 );
  }
  bVar1 = is_tight(rdbm2,r);
  if (bVar1) {
    sVar3 = variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)r);
    dVar2 = (db_t)reference_clock_variables_t::refcount(r);
    uVar4 = (ulong)(uint)dVar2;
    min_tx1 = dVar2;
    while( true ) {
      if (sVar3 <= (uint)min_tx1) {
        return true;
      }
      t = u[(uint)min_tx1 - uVar4];
      if (0x3ffffffe < (int)t) break;
      if (t != 0xc0000001) {
        if ((uint)min_tx1 < uVar4) {
          local_88 = (db_t *)&tchecker::dbm::LT_INFINITY;
        }
        else {
          local_88 = rdbm1 + (uint)min_tx1;
        }
        local_54 = *local_88;
        for (local_58 = 1; local_58 < uVar4; local_58 = local_58 + 1) {
          if ((uint)min_tx1 < uVar4) {
            local_90 = (db_t *)&tchecker::dbm::LT_INFINITY;
          }
          else {
            local_90 = rdbm1 + local_58 * sVar3 + (ulong)(uint)min_tx1;
          }
          min_tx2 = tchecker::dbm::min(&local_54,local_90);
          local_54 = min_tx2;
        }
        t_1 = (clock_id_t)tchecker::dbm::db(LE,-t);
        bVar1 = tchecker::dbm::operator<(&local_54,(db_t *)&t_1);
        if (!bVar1) {
          if ((uint)min_tx1 < uVar4) {
            local_98 = (db_t *)&tchecker::dbm::LT_INFINITY;
          }
          else {
            local_98 = rdbm2 + (uint)min_tx1;
          }
          local_64 = *local_98;
          for (y = 1; y < uVar4; y = y + 1) {
            if ((uint)min_tx1 < uVar4) {
              local_a0 = (db_t *)&tchecker::dbm::LT_INFINITY;
            }
            else {
              local_a0 = rdbm2 + y * sVar3 + (ulong)(uint)min_tx1;
            }
            Ly = (integer_t)tchecker::dbm::min(&local_64,local_a0);
            local_64 = (db_t)Ly;
          }
          bVar1 = tchecker::dbm::operator<(&local_64,&local_54);
          local_70 = dVar2;
          if (bVar1) {
            return false;
          }
          for (; (uint)local_70 < sVar3; local_70 = (db_t)((int)local_70 + 1)) {
            local_74 = l[(uint)local_70 - uVar4];
            if (0x3ffffffe < local_74) {
              __assert_fail("Ly < tchecker::dbm::INF_VALUE",
                            "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                            ,0x1d1,
                            "bool tchecker::refdbm::is_sync_alu_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, const tchecker::integer_t *, const tchecker::integer_t *)"
                           );
            }
            if ((min_tx1 != local_70) && (local_74 != -0x3fffffff)) {
              if ((uint)min_tx1 < uVar4) {
                local_a8 = (db_t *)&tchecker::dbm::LT_INFINITY;
              }
              else {
                local_a8 = rdbm2 + (uint)local_70 * sVar3 + (ulong)(uint)min_tx1;
              }
              if ((uint)min_tx1 < uVar4) {
                local_b8 = (db_t *)&tchecker::dbm::LT_INFINITY;
              }
              else {
                local_b8 = rdbm1 + (uint)local_70 * sVar3 + (ulong)(uint)min_tx1;
              }
              bVar1 = tchecker::dbm::operator<(local_a8,local_b8);
              local_b9 = false;
              if (bVar1) {
                if ((uint)min_tx1 < uVar4) {
                  local_c8 = (db_t *)&tchecker::dbm::LT_INFINITY;
                }
                else {
                  local_c8 = rdbm2 + (uint)local_70 * sVar3 + (ulong)(uint)min_tx1;
                }
                local_7c = tchecker::dbm::db(LT,-local_74);
                local_78 = tchecker::dbm::sum(local_c8,&local_7c);
                local_b9 = tchecker::dbm::operator<(&local_78,&local_54);
              }
              if (local_b9 != false) {
                return false;
              }
            }
          }
        }
      }
      min_tx1 = (db_t)((int)min_tx1 + 1);
    }
    __assert_fail("Ux < tchecker::dbm::INF_VALUE",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                  ,0x1b7,
                  "bool tchecker::refdbm::is_sync_alu_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, const tchecker::integer_t *, const tchecker::integer_t *)"
                 );
  }
  __assert_fail("tchecker::refdbm::is_tight(rdbm2, r)",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/refdbm.cc"
                ,0x19f,
                "bool tchecker::refdbm::is_sync_alu_le(const tchecker::dbm::db_t *, const tchecker::dbm::db_t *, const tchecker::reference_clock_variables_t &, const tchecker::integer_t *, const tchecker::integer_t *)"
               );
}

Assistant:

bool is_sync_alu_le(tchecker::dbm::db_t const * rdbm1, tchecker::dbm::db_t const * rdbm2,
                    tchecker::reference_clock_variables_t const & r, tchecker::integer_t const * l,
                    tchecker::integer_t const * u)
{
  assert(rdbm1 != nullptr);
  assert(rdbm2 != nullptr);
  assert(tchecker::refdbm::is_consistent(rdbm1, r));
  assert(tchecker::refdbm::is_consistent(rdbm2, r));
  assert(tchecker::refdbm::is_positive(rdbm1, r));
  assert(tchecker::refdbm::is_positive(rdbm2, r));
  assert(tchecker::refdbm::is_tight(rdbm1, r));
  assert(tchecker::refdbm::is_tight(rdbm2, r));

  // We apply the technique described in appendix C of Govind Rajanbabu's PhD thesis
  // "Partial-order reduction for timed automata", Université de Bordeaux, 2021
  //
  // let dbm1=local_time_elapse(rdbm1), dbm2=local_time_elapse(rdbm2)
  //
  // Let min_tx1 = min {dbm1[t,x] | t ref clock, x offset clock}
  // and min_tx2 = min {dbm2[t,x] | t ref clock, x offset clock}
  //
  // dbm1 not included in aLU(dbm2) if:
  // - either there is an offset clock x s.t.
  //     min_tx1 >= (<= -U(x))
  // &&  min_tx2 < min_tx1
  // - or there are two offset clocks x and y s.t.
  //     min_tx1 >= (<= -U(x))
  // &&  dbm2[y,x] < dbm1[y,x]
  // &&  dbm2[y,x] + (< -L(y)) < min_tx1

  std::size_t const rdim = r.size();
  std::size_t const refcount = r.refcount();

  for (tchecker::clock_id_t x = refcount; x < rdim; ++x) {
    tchecker::integer_t Ux = U(x);
    assert(Ux < tchecker::dbm::INF_VALUE);

    // Skip x as 1st condition cannot be satisfied
    if (Ux == -tchecker::dbm::INF_VALUE)
      continue;

    // Compute min_tx1 = min {dbm1[t,x] | t ref clock}
    tchecker::dbm::db_t min_tx1 = LTE_RDBM1(0, x);
    for (tchecker::clock_id_t t = 1; t < refcount; ++t)
      min_tx1 = tchecker::dbm::min(min_tx1, LTE_RDBM1(t, x));

    // Check 1st condition
    if (min_tx1 < tchecker::dbm::db(tchecker::LE, -Ux))
      continue;

    // Compute min_tx2 = min {dbm2[t,x] | t ref clock}
    tchecker::dbm::db_t min_tx2 = LTE_RDBM2(0, x);
    for (tchecker::clock_id_t t = 1; t < refcount; ++t)
      min_tx2 = tchecker::dbm::min(min_tx2, LTE_RDBM2(t, x));

    // Check 2nd condition (of first case above)
    if (min_tx2 < min_tx1)
      return false;

    for (tchecker::clock_id_t y = refcount; y < rdim; ++y) {
      tchecker::integer_t Ly = L(y);
      assert(Ly < tchecker::dbm::INF_VALUE);

      if (x == y)
        continue;

      // Skip y as 3rd condition cannot be satisfied
      if (Ly == -tchecker::dbm::INF_VALUE)
        continue;

      // Check 2nd and 3rd conditions (of second case above)
      if (LTE_RDBM2(y, x) < LTE_RDBM1(y, x) &&
          tchecker::dbm::sum(LTE_RDBM2(y, x), tchecker::dbm::db(tchecker::LT, -Ly)) < min_tx1)
        return false;
    }
  }

  return true;
}